

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O2

bool __thiscall
draco::AttributeQuantizationTransform::TransformAttribute
          (AttributeQuantizationTransform *this,PointAttribute *attribute,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,PointAttribute *target_attribute)

{
  if ((point_ids->
      super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (point_ids->
      super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    GeneratePortableAttribute(this,attribute,target_attribute->num_unique_entries_,target_attribute)
    ;
  }
  else {
    GeneratePortableAttribute(this,attribute,point_ids,(int)target_attribute,target_attribute);
  }
  return true;
}

Assistant:

bool AttributeQuantizationTransform::TransformAttribute(
    const PointAttribute &attribute, const std::vector<PointIndex> &point_ids,
    PointAttribute *target_attribute) {
  if (point_ids.empty()) {
    GeneratePortableAttribute(attribute, target_attribute->size(),
                              target_attribute);
  } else {
    GeneratePortableAttribute(attribute, point_ids, target_attribute->size(),
                              target_attribute);
  }
  return true;
}